

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialogPrivate::retranslateStrings(QProgressDialogPrivate *this)

{
  long lVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffcc;
  QString *in_stack_ffffffffffffffe8;
  QProgressDialogPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[0x34f] & 1U) != 0) {
    QProgressDialog::tr(in_RDI,in_RDI,in_stack_ffffffffffffffcc);
    setCancelButtonText(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    QString::~QString((QString *)0x7b0851);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialogPrivate::retranslateStrings()
{
    if (useDefaultCancelText)
        setCancelButtonText(QProgressDialog::tr("Cancel"));
}